

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.cpp
# Opt level: O2

void * embree::os_malloc(size_t bytes,bool *hugepages)

{
  void *pvVar1;
  undefined8 *puVar2;
  
  if (bytes == 0) {
    *hugepages = false;
    pvVar1 = (void *)0x0;
  }
  else {
    if (((huge_pages_enabled == '\x01') &&
        (((bytes + 0x1fffff & 0x7fffffffffe00000) - bytes) * 0x42 < bytes)) &&
       (pvVar1 = mmap((void *)0x0,bytes,3,0x40022,-1,0), pvVar1 != (void *)0xffffffffffffffff)) {
      *hugepages = true;
      return pvVar1;
    }
    pvVar1 = mmap((void *)0x0,bytes,3,0x22,-1,0);
    if (pvVar1 == (void *)0xffffffffffffffff) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar2 = rtcSetGeometryTimeRange;
      __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    *hugepages = false;
    os_advise(pvVar1,bytes);
  }
  return pvVar1;
}

Assistant:

void* os_malloc(size_t bytes, bool& hugepages)
  { 
    if (bytes == 0) {
      hugepages = false;
      return nullptr;
    }

    /* try direct huge page allocation first */
    if (isHugePageCandidate(bytes)) 
    {
#if defined(__MACOSX__)
      void* ptr = mmap(0, bytes, PROT_READ | PROT_WRITE, MAP_PRIVATE | MAP_ANON, VM_FLAGS_SUPERPAGE_SIZE_2MB, 0);
      if (ptr != MAP_FAILED) {
        hugepages = true;
        return ptr;
      }
#elif defined(MAP_HUGETLB)
      void* ptr = mmap(0, bytes, PROT_READ | PROT_WRITE, MAP_PRIVATE | MAP_ANON | MAP_HUGETLB, -1, 0);
      if (ptr != MAP_FAILED) {
        hugepages = true;
        return ptr;
      }
#endif
    } 

    /* fallback to 4k pages */
    void* ptr = (char*) mmap(0, bytes, PROT_READ | PROT_WRITE, MAP_PRIVATE | MAP_ANON, -1, 0);
    if (ptr == MAP_FAILED) throw std::bad_alloc();
    hugepages = false;

    /* advise huge page hint for THP */
    os_advise(ptr,bytes);
    return ptr;
  }